

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void ConvertRGB24ToY_SSE2(uint8_t *rgb,uint8_t *y,int width)

{
  uint8_t *puVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  int iVar30;
  long lVar31;
  __m128i b;
  __m128i g;
  __m128i r;
  __m128i Y1;
  __m128i Y0;
  __m128i rgb_plane [6];
  __m128i local_118;
  __m128i local_108;
  __m128i local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  longlong local_98 [4];
  undefined1 auStack_78 [32];
  undefined1 auStack_58 [40];
  
  for (iVar30 = 0; iVar30 < (int)(width & 0xffffffe0U); iVar30 = iVar30 + 0x20) {
    RGB24PackedToPlanar_SSE2(rgb,(__m128i *)local_98);
    for (lVar31 = 0; lVar31 != 0x20; lVar31 = lVar31 + 0x10) {
      local_c8 = *(undefined1 (*) [16])((long)local_98 + lVar31);
      local_e8 = *(undefined1 (*) [16])(auStack_78 + lVar31);
      local_d8 = *(undefined1 (*) [16])(auStack_58 + lVar31);
      auVar4[0xd] = 0;
      auVar4._0_13_ = local_c8._0_13_;
      auVar4[0xe] = local_c8[7];
      auVar7[0xc] = local_c8[6];
      auVar7._0_12_ = local_c8._0_12_;
      auVar7._13_2_ = auVar4._13_2_;
      auVar10[0xb] = 0;
      auVar10._0_11_ = local_c8._0_11_;
      auVar10._12_3_ = auVar7._12_3_;
      auVar13[10] = local_c8[5];
      auVar13._0_10_ = local_c8._0_10_;
      auVar13._11_4_ = auVar10._11_4_;
      auVar16[9] = 0;
      auVar16._0_9_ = local_c8._0_9_;
      auVar16._10_5_ = auVar13._10_5_;
      auVar19[8] = local_c8[4];
      auVar19._0_8_ = local_c8._0_8_;
      auVar19._9_6_ = auVar16._9_6_;
      auVar21._7_8_ = 0;
      auVar21._0_7_ = auVar19._8_7_;
      auVar24._1_8_ = SUB158(auVar21 << 0x40,7);
      auVar24[0] = local_c8[3];
      auVar24._9_6_ = 0;
      auVar25._1_10_ = SUB1510(auVar24 << 0x30,5);
      auVar25[0] = local_c8[2];
      auVar25._11_4_ = 0;
      local_f8._3_12_ = SUB1512(auVar25 << 0x20,3);
      local_f8[0]._2_1_ = local_c8[1];
      local_f8[0]._0_2_ = (ushort)local_c8[0];
      local_f8[1]._7_1_ = 0;
      auVar2[0xd] = 0;
      auVar2._0_13_ = local_e8._0_13_;
      auVar2[0xe] = local_e8[7];
      auVar5[0xc] = local_e8[6];
      auVar5._0_12_ = local_e8._0_12_;
      auVar5._13_2_ = auVar2._13_2_;
      auVar8[0xb] = 0;
      auVar8._0_11_ = local_e8._0_11_;
      auVar8._12_3_ = auVar5._12_3_;
      auVar11[10] = local_e8[5];
      auVar11._0_10_ = local_e8._0_10_;
      auVar11._11_4_ = auVar8._11_4_;
      auVar14[9] = 0;
      auVar14._0_9_ = local_e8._0_9_;
      auVar14._10_5_ = auVar11._10_5_;
      auVar17[8] = local_e8[4];
      auVar17._0_8_ = local_e8._0_8_;
      auVar17._9_6_ = auVar14._9_6_;
      auVar22._7_8_ = 0;
      auVar22._0_7_ = auVar17._8_7_;
      auVar26._1_8_ = SUB158(auVar22 << 0x40,7);
      auVar26[0] = local_e8[3];
      auVar26._9_6_ = 0;
      auVar27._1_10_ = SUB1510(auVar26 << 0x30,5);
      auVar27[0] = local_e8[2];
      auVar27._11_4_ = 0;
      auVar20[2] = local_e8[1];
      auVar20._0_2_ = local_e8._0_2_;
      auVar20._3_12_ = SUB1512(auVar27 << 0x20,3);
      local_108[0]._0_2_ = local_e8._0_2_ & 0xff;
      local_108._2_13_ = auVar20._2_13_;
      local_108[1]._7_1_ = 0;
      auVar3[0xd] = 0;
      auVar3._0_13_ = local_d8._0_13_;
      auVar3[0xe] = local_d8[7];
      auVar6[0xc] = local_d8[6];
      auVar6._0_12_ = local_d8._0_12_;
      auVar6._13_2_ = auVar3._13_2_;
      auVar9[0xb] = 0;
      auVar9._0_11_ = local_d8._0_11_;
      auVar9._12_3_ = auVar6._12_3_;
      auVar12[10] = local_d8[5];
      auVar12._0_10_ = local_d8._0_10_;
      auVar12._11_4_ = auVar9._11_4_;
      auVar15[9] = 0;
      auVar15._0_9_ = local_d8._0_9_;
      auVar15._10_5_ = auVar12._10_5_;
      auVar18[8] = local_d8[4];
      auVar18._0_8_ = local_d8._0_8_;
      auVar18._9_6_ = auVar15._9_6_;
      auVar23._7_8_ = 0;
      auVar23._0_7_ = auVar18._8_7_;
      auVar28._1_8_ = SUB158(auVar23 << 0x40,7);
      auVar28[0] = local_d8[3];
      auVar28._9_6_ = 0;
      auVar29._1_10_ = SUB1510(auVar28 << 0x30,5);
      auVar29[0] = local_d8[2];
      auVar29._11_4_ = 0;
      local_118._3_12_ = SUB1512(auVar29 << 0x20,3);
      local_118[0]._2_1_ = local_d8[1];
      local_118[0]._0_2_ = (ushort)local_d8[0];
      local_118[1]._7_1_ = 0;
      ConvertRGBToY_SSE2(&local_f8,&local_108,&local_118,(__m128i *)&local_a8);
      local_f8[0] = (ulong)CONCAT16(local_c8[0xb],
                                    (uint6)CONCAT14(local_c8[10],
                                                    (uint)CONCAT12(local_c8[9],(ushort)local_c8[8]))
                                   );
      local_f8[1]._0_1_ = local_c8[0xc];
      local_f8[1]._1_1_ = 0;
      local_f8[1]._2_1_ = local_c8[0xd];
      local_f8[1]._3_1_ = 0;
      local_f8[1]._4_1_ = local_c8[0xe];
      local_f8[1]._5_1_ = 0;
      local_f8[1]._6_1_ = local_c8[0xf];
      local_f8[1]._7_1_ = 0;
      local_108[0] = (ulong)CONCAT16(local_e8[0xb],
                                     (uint6)CONCAT14(local_e8[10],
                                                     (uint)CONCAT12(local_e8[9],(ushort)local_e8[8])
                                                    ));
      local_108[1]._0_1_ = local_e8[0xc];
      local_108[1]._1_1_ = 0;
      local_108[1]._2_1_ = local_e8[0xd];
      local_108[1]._3_1_ = 0;
      local_108[1]._4_1_ = local_e8[0xe];
      local_108[1]._5_1_ = 0;
      local_108[1]._6_1_ = local_e8[0xf];
      local_108[1]._7_1_ = 0;
      local_118[0] = (ulong)CONCAT16(local_d8[0xb],
                                     (uint6)CONCAT14(local_d8[10],
                                                     (uint)CONCAT12(local_d8[9],(ushort)local_d8[8])
                                                    ));
      local_118[1]._0_1_ = local_d8[0xc];
      local_118[1]._1_1_ = 0;
      local_118[1]._2_1_ = local_d8[0xd];
      local_118[1]._3_1_ = 0;
      local_118[1]._4_1_ = local_d8[0xe];
      local_118[1]._5_1_ = 0;
      local_118[1]._6_1_ = local_d8[0xf];
      local_118[1]._7_1_ = 0;
      ConvertRGBToY_SSE2(&local_f8,&local_108,&local_118,(__m128i *)&local_b8);
      puVar1 = y + lVar31 + iVar30;
      *puVar1 = (0 < local_a8) * (local_a8 < 0x100) * (char)local_a8 - (0xff < local_a8);
      puVar1[1] = (0 < sStack_a6) * (sStack_a6 < 0x100) * (char)sStack_a6 - (0xff < sStack_a6);
      puVar1[2] = (0 < sStack_a4) * (sStack_a4 < 0x100) * (char)sStack_a4 - (0xff < sStack_a4);
      puVar1[3] = (0 < sStack_a2) * (sStack_a2 < 0x100) * (char)sStack_a2 - (0xff < sStack_a2);
      puVar1[4] = (0 < sStack_a0) * (sStack_a0 < 0x100) * (char)sStack_a0 - (0xff < sStack_a0);
      puVar1[5] = (0 < sStack_9e) * (sStack_9e < 0x100) * (char)sStack_9e - (0xff < sStack_9e);
      puVar1[6] = (0 < sStack_9c) * (sStack_9c < 0x100) * (char)sStack_9c - (0xff < sStack_9c);
      puVar1[7] = (0 < sStack_9a) * (sStack_9a < 0x100) * (char)sStack_9a - (0xff < sStack_9a);
      puVar1[8] = (0 < local_b8) * (local_b8 < 0x100) * (char)local_b8 - (0xff < local_b8);
      puVar1[9] = (0 < sStack_b6) * (sStack_b6 < 0x100) * (char)sStack_b6 - (0xff < sStack_b6);
      puVar1[10] = (0 < sStack_b4) * (sStack_b4 < 0x100) * (char)sStack_b4 - (0xff < sStack_b4);
      puVar1[0xb] = (0 < sStack_b2) * (sStack_b2 < 0x100) * (char)sStack_b2 - (0xff < sStack_b2);
      puVar1[0xc] = (0 < sStack_b0) * (sStack_b0 < 0x100) * (char)sStack_b0 - (0xff < sStack_b0);
      puVar1[0xd] = (0 < sStack_ae) * (sStack_ae < 0x100) * (char)sStack_ae - (0xff < sStack_ae);
      puVar1[0xe] = (0 < sStack_ac) * (sStack_ac < 0x100) * (char)sStack_ac - (0xff < sStack_ac);
      puVar1[0xf] = (0 < sStack_aa) * (sStack_aa < 0x100) * (char)sStack_aa - (0xff < sStack_aa);
    }
    rgb = rgb + 0x60;
  }
  for (lVar31 = (long)iVar30; lVar31 < width; lVar31 = lVar31 + 1) {
    y[lVar31] = (uint8_t)((uint)rgb[2] * 0x1914 + (uint)rgb[1] * 0x8123 + (uint)*rgb * 0x41c7 +
                          0x108000 >> 0x10);
    rgb = rgb + 3;
  }
  return;
}

Assistant:

static void ConvertRGB24ToY_SSE2(const uint8_t* rgb, uint8_t* y, int width) {
  const int max_width = width & ~31;
  int i;
  for (i = 0; i < max_width; rgb += 3 * 16 * 2) {
    __m128i rgb_plane[6];
    int j;

    RGB24PackedToPlanar_SSE2(rgb, rgb_plane);

    for (j = 0; j < 2; ++j, i += 16) {
      const __m128i zero = _mm_setzero_si128();
      __m128i r, g, b, Y0, Y1;

      // Convert to 16-bit Y.
      r = _mm_unpacklo_epi8(rgb_plane[0 + j], zero);
      g = _mm_unpacklo_epi8(rgb_plane[2 + j], zero);
      b = _mm_unpacklo_epi8(rgb_plane[4 + j], zero);
      ConvertRGBToY_SSE2(&r, &g, &b, &Y0);

      // Convert to 16-bit Y.
      r = _mm_unpackhi_epi8(rgb_plane[0 + j], zero);
      g = _mm_unpackhi_epi8(rgb_plane[2 + j], zero);
      b = _mm_unpackhi_epi8(rgb_plane[4 + j], zero);
      ConvertRGBToY_SSE2(&r, &g, &b, &Y1);

      // Cast to 8-bit and store.
      STORE_16(_mm_packus_epi16(Y0, Y1), y + i);
    }
  }
  for (; i < width; ++i, rgb += 3) {   // left-over
    y[i] = VP8RGBToY(rgb[0], rgb[1], rgb[2], YUV_HALF);
  }
}